

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

void gravity_fiber_free(gravity_vm *vm,gravity_fiber_t *fiber)

{
  gravity_fiber_t *fiber_local;
  gravity_vm *vm_local;
  
  if (fiber->error != (char *)0x0) {
    free(fiber->error);
  }
  free(fiber->stack);
  free(fiber->frames);
  free(fiber);
  return;
}

Assistant:

void gravity_fiber_free (gravity_vm *vm, gravity_fiber_t *fiber) {
    #pragma unused(vm)

    DEBUG_FREE("FREE %s", gravity_object_debug((gravity_object_t *)fiber, true));
    if (fiber->error) mem_free(fiber->error);
    mem_free(fiber->stack);
    mem_free(fiber->frames);
    mem_free(fiber);
}